

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::injected_class_member::test_method(injected_class_member *this)

{
  int iVar1;
  ptr_type *ppVar2;
  ptr_type *ppVar3;
  undefined4 extraout_var;
  component<Inject::with_injected_member> b4;
  component<Inject::impl1> b2;
  component<Inject::service> b1;
  undefined1 local_180 [8];
  injected<Inject::with_injected_member> p;
  undefined **local_168;
  undefined1 local_160;
  _Base_ptr local_158;
  _Base_ptr local_150;
  size_t local_148;
  provides<Inject::with_injected_member> b5;
  provides<Inject::service> b3;
  _Base_ptr local_130;
  _Base_ptr local_128;
  undefined1 local_120 [8];
  size_t local_118;
  shared_count sStack_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  context<0> c;
  char *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  _Base_ptr *local_30;
  
  inject::context<0>::component<Inject::service>::component(&b1);
  inject::context<0>::component<Inject::impl1>::component(&b2);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&b3);
  inject::context<0>::component<Inject::with_injected_member>::component(&b4);
  inject::context<0>::component<Inject::with_injected_member>::
  provides<Inject::with_injected_member>::provides(&b5);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::
  bind<Inject::with_injected_member,Inject::with_injected_member,(inject::component_scope)0>(&c);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::with_injected_member>((context<0> *)&p);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x1a0);
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_00163f68;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_150 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::with_injected_member>::ptr(&p);
  ppVar3 = inject::context<0>::injected<Inject::service>::ptr(&ppVar2->px->my_service);
  iVar1 = (**ppVar3->px->_vptr_service)();
  local_180 = (undefined1  [8])CONCAT44(extraout_var,iVar1);
  local_148 = inject::id_of<Inject::impl1>::id();
  local_120[0] = CONCAT44(extraout_var,iVar1) == local_148;
  local_130 = (_Base_ptr)&stack0xfffffffffffffeb8;
  local_118 = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_70 = "";
  local_128 = (_Base_ptr)local_180;
  local_30 = &local_128;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_00163fb8;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_50 = (undefined1 *)&stack0xfffffffffffffed0;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_00163fb8;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_120,&local_168,&local_78,0x1a0,1,2,2,"p->my_service->id()",&local_48,
             "id_of<impl1>::id()",&local_68);
  boost::detail::shared_count::~shared_count(&sStack_110);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::with_injected_member>::~component(&b4);
  inject::context<0>::component<Inject::impl1>::~component(&b2);
  inject::context<0>::component<Inject::service>::~component(&b1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(injected_class_member)
{
    context<>::component<service> b1;
    context<>::component<impl1> b2;
    context<>::component<impl1>::provides<service> b3;
    context<>::component<with_injected_member> b4;
    context<>::component<with_injected_member>::provides<with_injected_member> b5;

    context<> c;
    
    c.bind<service, impl1>();
    c.bind<with_injected_member>();

    context<>::injected<with_injected_member> p;
    BOOST_CHECK_EQUAL(p->my_service->id(), id_of<impl1>::id());
}